

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_rEr.cpp
# Opt level: O0

vector<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_> *
DronePoseLib::ValtonenOrnhagArxiv2021Extra::get_rEr
          (vector<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_>
           *__return_storage_ptr__,MatrixXd *p1,MatrixXd *p2,Matrix3d *R1,Matrix3d *R2,
          double focal_length)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Index IVar7;
  double *pdVar8;
  CommaInitializer<Eigen::Matrix<double,_22,_1,_0,_22,_1>_> *pCVar9;
  Scalar *pSVar10;
  Index IVar11;
  Scalar *pSVar12;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  Scalar *pSVar13;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar14;
  double extraout_XMM0_Qa;
  double dVar15;
  __type _Var16;
  Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> local_860;
  Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
  local_840;
  Product<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::DiagonalMatrix<double,_3,_3>,_1>
  local_818;
  Scalar local_7d8;
  Scalar local_7d0;
  Scalar local_7c8;
  Scalar local_7c0;
  Scalar local_7b8;
  Scalar local_7b0;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_7a8;
  Nested local_788;
  Scalar local_780;
  double local_778;
  double local_770;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_768;
  ColXpr local_748;
  HouseholderSequenceType local_718;
  non_const_type local_6f0;
  undefined1 local_6e8 [8];
  ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> qr;
  int local_5a4;
  undefined1 local_5a0 [4];
  int i;
  Matrix3d skew_t;
  DiagonalMatrix<double,_3,_3> Kinv;
  Vector3d kinv;
  Matrix3d Q;
  RelPose relpose;
  undefined1 local_468 [8];
  Matrix3d M;
  double thresh;
  Vector4cd r;
  undefined1 local_3d0 [8];
  Matrix<double,_5,_1,_0,_5,_1> coeffs;
  ColXpr local_378;
  ColXpr local_348;
  ColXpr local_318;
  ColXpr local_2e0;
  ColXpr local_2a8;
  ColXpr local_270;
  ColXpr local_238;
  ColXpr local_200;
  CommaInitializer<Eigen::Matrix<double,_22,_1,_0,_22,_1>_> local_1c8;
  undefined1 local_1a8 [8];
  Matrix<double,_22,_1,_0,_22,_1> x;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>
  local_f0;
  Matrix<double,3,3,0,3,3> local_e0 [8];
  Matrix3d R;
  undefined1 local_88 [8];
  MatrixXd pp2;
  MatrixXd pp1;
  double scale;
  double scale2;
  double scale1;
  double dStack_38;
  int nbr_pts;
  double focal_length_local;
  Matrix3d *R2_local;
  Matrix3d *R1_local;
  MatrixXd *p2_local;
  MatrixXd *p1_local;
  vector<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_> *output;
  
  scale1._4_4_ = 3;
  dStack_38 = focal_length;
  focal_length_local = (double)R2;
  R2_local = R1;
  R1_local = (Matrix3d *)p2;
  p2_local = p1;
  p1_local = (MatrixXd *)__return_storage_ptr__;
  IVar7 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&p1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  if (IVar7 != 2) {
    __assert_fail("p1.rows() == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/DronePoseLib/src/solvers/valtonenornhag_arxiv_2021/rEr/get_rEr.cpp"
                  ,0x2e,
                  "std::vector<RelPose> DronePoseLib::ValtonenOrnhagArxiv2021Extra::get_rEr(const Eigen::MatrixXd &, const Eigen::MatrixXd &, const Eigen::Matrix3d &, const Eigen::Matrix3d &, double)"
                 );
  }
  IVar7 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)R1_local);
  if (IVar7 != 2) {
    __assert_fail("p2.rows() == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/DronePoseLib/src/solvers/valtonenornhag_arxiv_2021/rEr/get_rEr.cpp"
                  ,0x2f,
                  "std::vector<RelPose> DronePoseLib::ValtonenOrnhagArxiv2021Extra::get_rEr(const Eigen::MatrixXd &, const Eigen::MatrixXd &, const Eigen::Matrix3d &, const Eigen::Matrix3d &, double)"
                 );
  }
  IVar7 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    (&p2_local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  if (IVar7 != scale1._4_4_) {
    __assert_fail("p1.cols() == nbr_pts",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/DronePoseLib/src/solvers/valtonenornhag_arxiv_2021/rEr/get_rEr.cpp"
                  ,0x30,
                  "std::vector<RelPose> DronePoseLib::ValtonenOrnhagArxiv2021Extra::get_rEr(const Eigen::MatrixXd &, const Eigen::MatrixXd &, const Eigen::Matrix3d &, const Eigen::Matrix3d &, double)"
                 );
  }
  IVar7 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)R1_local);
  if (IVar7 != scale1._4_4_) {
    __assert_fail("p2.cols() == nbr_pts",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/marcusvaltonen[P]python-droneposelib/lib/DronePoseLib/src/solvers/valtonenornhag_arxiv_2021/rEr/get_rEr.cpp"
                  ,0x31,
                  "std::vector<RelPose> DronePoseLib::ValtonenOrnhagArxiv2021Extra::get_rEr(const Eigen::MatrixXd &, const Eigen::MatrixXd &, const Eigen::Matrix3d &, const Eigen::Matrix3d &, double)"
                 );
  }
  scale2 = normalize2dpts(p2_local);
  scale = normalize2dpts((MatrixXd *)R1_local);
  pdVar8 = std::max<double>(&scale2,&scale);
  pp1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)*pdVar8;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             &pp2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             p2_local);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_88,
             (Matrix<double,__1,__1,_0,__1,__1> *)R1_local);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             &pp2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             (Scalar *)
             &pp1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols)
  ;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_88,
             (Scalar *)
             &pp1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols)
  ;
  dVar15 = focal_length_local;
  dStack_38 = dStack_38 *
              (double)pp1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                      .m_cols;
  x.super_PlainObjectBase<Eigen::Matrix<double,_22,_1,_0,_22,_1>_>.m_storage.m_data.array[0x15] =
       (double)Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                         ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)R2_local);
  local_f0 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                       ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)dVar15,
                        (MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                         *)(x.super_PlainObjectBase<Eigen::Matrix<double,_22,_1,_0,_22,_1>_>.
                            m_storage.m_data.array + 0x15));
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,0>>
            (local_e0,(EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>
                       *)&local_f0);
  Eigen::Matrix<double,_22,_1,_0,_22,_1>::Matrix((Matrix<double,_22,_1,_0,_22,_1> *)local_1a8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (&local_200,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             &pp2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             0);
  Eigen::DenseBase<Eigen::Matrix<double,22,1,0,22,1>>::operator<<
            (&local_1c8,(DenseBase<Eigen::Matrix<double,22,1,0,22,1>> *)local_1a8,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
             &local_200);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (&local_238,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             &pp2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             1);
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>> *)&local_1c8,
                      (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                       *)&local_238);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (&local_270,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             &pp2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             2);
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>> *)pCVar9,
                      (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                       *)&local_270);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (&local_2a8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_88,0);
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>> *)pCVar9,
                      (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                       *)&local_2a8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (&local_2e0,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_88,1);
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>> *)pCVar9,
                      (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                       *)&local_2e0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (&local_318,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_88,2);
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>> *)pCVar9,
                      (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                       *)&local_318);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            (&local_348,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_e0,0);
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>> *)pCVar9,
                      (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                      &local_348);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            (&local_378,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_e0,1);
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>> *)pCVar9,
                      (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                      &local_378);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((ColXpr *)
             (coeffs.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.
              array + 4),(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_e0,2);
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,22,1,0,22,1>> *)pCVar9,
                      (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                      (coeffs.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage
                       .m_data.array + 4));
  Eigen::CommaInitializer<Eigen::Matrix<double,_22,_1,_0,_22,_1>_>::operator_
            (pCVar9,&stack0xffffffffffffffc8);
  Eigen::CommaInitializer<Eigen::Matrix<double,_22,_1,_0,_22,_1>_>::~CommaInitializer(&local_1c8);
  calculate_coefficients
            ((Matrix<double,_5,_1,_0,_5,_1> *)local_3d0,(Matrix<double,_22,_1,_0,_22,_1> *)local_1a8
            );
  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)local_3d0,1);
  dVar15 = *pSVar10;
  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)local_3d0,0);
  dVar1 = *pSVar10;
  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)local_3d0,2);
  dVar2 = *pSVar10;
  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)local_3d0,0);
  dVar3 = *pSVar10;
  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)local_3d0,3);
  dVar4 = *pSVar10;
  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)local_3d0,0);
  dVar5 = *pSVar10;
  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)local_3d0,4);
  dVar6 = *pSVar10;
  pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)local_3d0,0);
  solve_quartic((Vector4cd *)&thresh,dVar15 / dVar1,dVar2 / dVar3,dVar4 / dVar5,dVar6 / *pSVar10);
  M.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 1e-12;
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)local_468);
  relpose.r._7_1_ = 0;
  std::vector<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_>::vector
            (__return_storage_ptr__);
  RelPose::RelPose((RelPose *)
                   (Q.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + 8));
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix
            ((Matrix<double,_3,_3,_0,_3,_3> *)
             (kinv.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (Kinv.m_diagonal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
              .m_data.array + 2));
  Eigen::DiagonalMatrix<double,_3,_3>::DiagonalMatrix
            ((DiagonalMatrix<double,_3,_3> *)
             (skew_t.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
              array + 8));
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)local_5a0);
  local_5a4 = 0;
  while( true ) {
    IVar11 = Eigen::EigenBase<Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>_>::size
                       ((EigenBase<Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>_> *)&thresh);
    if (IVar11 <= local_5a4) break;
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>,_1>::
              operator[]((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>,_1> *)
                         &thresh,(long)local_5a4);
    std::imag<double>(pSVar12);
    std::abs((int)pSVar12);
    if (extraout_XMM0_Qa <
        M.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]) {
      pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>,_1>::
                operator[]((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>,_1> *
                           )&thresh,(long)local_5a4);
      dVar15 = std::real<double>(pSVar12);
      create_M((Matrix3d *)&qr.m_det_pq,dVar15,(Matrix<double,_22,_1,_0,_22,_1> *)local_1a8);
      Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
                ((Matrix<double,_3,_3,_0,_3,_3> *)local_468,
                 (Matrix<double,_3,_3,_0,_3,_3> *)&qr.m_det_pq);
      local_6f0 = (non_const_type)
                  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_468);
      Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>::
      colPivHouseholderQr((ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_6e8,
                          (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                          &local_6f0);
      Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::householderQ
                (&local_718,(ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_6e8)
      ;
      Eigen::Matrix<double,3,3,0,3,3>::operator=
                ((Matrix<double,3,3,0,3,3> *)
                 (kinv.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2),
                 (EigenBase<Eigen::HouseholderSequence<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>_>
                  *)&local_718);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
                (&local_748,
                 (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                 (kinv.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                  .array + 2),2);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                ((Matrix<double,3,1,0,3,1> *)
                 (relpose.F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array + 8),
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 &local_748);
      relpose.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = dStack_38 /
            (double)pp1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_cols;
      pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>,_1>::
                operator[]((DenseCoeffsBase<Eigen::Matrix<std::complex<double>,_4,_1,_0,_4,_1>,_1> *
                           )&thresh,(long)local_5a4);
      dVar15 = std::real<double>(pSVar12);
      _Var16 = std::pow<double,int>
                         ((double)pp1.
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                  m_storage.m_cols,2);
      relpose.f = dVar15 * _Var16;
      local_770 = 1.0 / relpose.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data.array[2];
      Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<
                (&local_768,
                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                 (Kinv.m_diagonal.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array + 2),&local_770);
      local_778 = 1.0 / relpose.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data.array[2];
      this = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                       (&local_768,&local_778);
      local_780 = 1.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(this,&local_780);
      Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_768);
      local_788 = (Nested)Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::asDiagonal
                                    ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                                     (Kinv.m_diagonal.
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                      m_storage.m_data.array + 2));
      Eigen::DiagonalMatrix<double,3,3>::operator=
                ((DiagonalMatrix<double,3,3> *)
                 (skew_t.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array + 8),
                 (DiagonalBase<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)&local_788);
      local_7b0 = 0.0;
      Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator<<
                (&local_7a8,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_5a0,&local_7b0
                );
      pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                           (relpose.F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array + 8),2);
      local_7b8 = -*pSVar13;
      pCVar14 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          (&local_7a8,&local_7b8);
      pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                           (relpose.F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array + 8),1);
      pCVar14 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          (pCVar14,pSVar13);
      pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                           (relpose.F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array + 8),2);
      pCVar14 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          (pCVar14,pSVar13);
      local_7c0 = 0.0;
      pCVar14 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          (pCVar14,&local_7c0);
      pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                           (relpose.F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array + 8),0);
      local_7c8 = -*pSVar13;
      pCVar14 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          (pCVar14,&local_7c8);
      pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                           (relpose.F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array + 8),1);
      local_7d0 = -*pSVar13;
      pCVar14 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          (pCVar14,&local_7d0);
      pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                           (relpose.F.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                            m_storage.m_data.array + 8),0);
      pCVar14 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          (pCVar14,pSVar13);
      local_7d8 = 0.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar14,&local_7d8);
      Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::~CommaInitializer(&local_7a8);
      Eigen::DiagonalBase<Eigen::DiagonalMatrix<double,3,3>>::operator*
                (&local_860,
                 (DiagonalBase<Eigen::DiagonalMatrix<double,3,3>> *)
                 (skew_t.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array + 8),(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_5a0);
      Eigen::
      MatrixBase<Eigen::Product<Eigen::DiagonalMatrix<double,3,3>,Eigen::Matrix<double,3,3,0,3,3>,1>>
      ::operator*(&local_840,
                  (MatrixBase<Eigen::Product<Eigen::DiagonalMatrix<double,3,3>,Eigen::Matrix<double,3,3,0,3,3>,1>>
                   *)&local_860,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_e0);
      Eigen::
      MatrixBase<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,3,3>,Eigen::Matrix<double,3,3,0,3,3>,1>,Eigen::Matrix<double,3,3,0,3,3>,0>>
      ::operator*(&local_818,
                  (MatrixBase<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,3,3>,Eigen::Matrix<double,3,3,0,3,3>,1>,Eigen::Matrix<double,3,3,0,3,3>,0>>
                   *)&local_840,
                  (DiagonalBase<Eigen::DiagonalMatrix<double,_3,_3>_> *)
                  (skew_t.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array + 8));
      Eigen::Matrix<double,3,3,0,3,3>::operator=
                ((Matrix<double,3,3,0,3,3> *)
                 (Q.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array + 8),
                 (DenseBase<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::DiagonalMatrix<double,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::DiagonalMatrix<double,_3,_3>,_1>_>
                  *)&local_818);
      std::vector<DronePoseLib::RelPose,_std::allocator<DronePoseLib::RelPose>_>::push_back
                (__return_storage_ptr__,
                 (value_type *)
                 (Q.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array + 8));
      Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::~ColPivHouseholderQR
                ((ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_6e8);
    }
    local_5a4 = local_5a4 + 1;
  }
  relpose.r._7_1_ = 1;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_88);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             &pp2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::vector<RelPose> get_rEr(
        const Eigen::MatrixXd &p1,
        const Eigen::MatrixXd &p2,
        const Eigen::Matrix3d &R1,
        const Eigen::Matrix3d &R2,
        double focal_length
    ) {
        // This is a 3-point method
        int nbr_pts = 3;

        // We expect inhomogenous input data, i.e. p1 and p2 are 2x3 matrices
        assert(p1.rows() == 2);
        assert(p2.rows() == 2);
        assert(p1.cols() == nbr_pts);
        assert(p2.cols() == nbr_pts);

        // Compute normalization matrix
        double scale1 = normalize2dpts(p1);
        double scale2 = normalize2dpts(p2);
        double scale = std::max(scale1, scale2);

        // Make a copy
        Eigen::MatrixXd pp1 = p1;
        Eigen::MatrixXd pp2 = p2;
        pp1 *= scale;
        pp2 *= scale;
        focal_length *= scale;

        // Compute relative rotation
        Eigen::Matrix3d R = R2 * R1.transpose();

        Eigen::Matrix<double, 22, 1> x;
        x << pp1.col(0), pp1.col(1), pp1.col(2),
             pp2.col(0), pp2.col(1), pp2.col(2),
             R.col(0), R.col(1), R.col(2), focal_length;

        Eigen::Matrix<double, 5, 1> coeffs = calculate_coefficients(x);

        Eigen::Vector4cd r  = solve_quartic(
            coeffs(1) / coeffs(0),
            coeffs(2) / coeffs(0),
            coeffs(3) / coeffs(0),
            coeffs(4) / coeffs(0));

        // Construct putative output
        double thresh = 1e-12;
        Eigen::Matrix3d M;
        std::vector<RelPose> output;
        RelPose relpose;
        Eigen::Matrix3d Q;
        Eigen::Vector3d kinv;
        Eigen::DiagonalMatrix<double, 3> Kinv;
        Eigen::Matrix3d skew_t;

        // Householder is just 500 ns slower than null3, but is significantly more stable
        for (int i=0; i < r.size(); i++) {
            if (std::abs(std::imag(r[i])) < thresh) {
                M = create_M(std::real(r[i]), x);
                auto qr = M.transpose().colPivHouseholderQr();
                Q = qr.householderQ();
                relpose.t = Q.col(2);
                relpose.f = focal_length / scale;
                relpose.r = std::real(r[i]) * std::pow(scale, 2);

                // Compute fundamental matrix
                kinv << 1.0 / relpose.f, 1.0 / relpose.f, 1.0;
                Kinv = kinv.asDiagonal();
                skew_t << 0, -relpose.t(2), relpose.t(1),
                          relpose.t(2), 0, -relpose.t(0),
                         -relpose.t(1), relpose.t(0), 0;
                relpose.F = Kinv * skew_t * R * Kinv;

                output.push_back(relpose);
            }
        }

        return output;
    }